

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall front::syntax::SyntaxAnalyze::gm_while_stmt_normal(SyntaxAnalyze *this)

{
  WhileLabels wl;
  LabelId endLabel;
  LabelId beginLabel;
  element_type *peVar1;
  long in_RDI;
  RightVal right;
  string tmpName;
  WhileLabels whileLabels;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> condStr
  ;
  LabelId whileBegin;
  LabelId whileEnd;
  LabelId whileTrue;
  SharedExNdPtr cond;
  irGenerator *in_stack_fffffffffffffe48;
  LabelId in_stack_fffffffffffffe50;
  LabelId in_stack_fffffffffffffe54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe60;
  LabelId in_stack_fffffffffffffebc;
  irGenerator *in_stack_fffffffffffffec0;
  SyntaxAnalyze *in_stack_ffffffffffffff10;
  string local_a0 [48];
  WhileLabels in_stack_ffffffffffffff98;
  WhileLabels dest;
  undefined4 in_stack_ffffffffffffffa0;
  JumpKind in_stack_ffffffffffffffa4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa8;
  LabelId in_stack_ffffffffffffffb4;
  LabelId in_stack_ffffffffffffffb8;
  JumpInstructionKind in_stack_ffffffffffffffbc;
  SyntaxAnalyze *in_stack_ffffffffffffffc0;
  TyKind in_stack_ffffffffffffffd4;
  irGenerator *in_stack_ffffffffffffffd8;
  
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ae849);
  irGenerator::irGenerator::getNewLabelId((irGenerator *)(in_RDI + 0x80));
  endLabel = irGenerator::irGenerator::getNewLabelId((irGenerator *)(in_RDI + 0x80));
  beginLabel = irGenerator::irGenerator::getNewLabelId((irGenerator *)(in_RDI + 0x80));
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x2ae8b3);
  irGenerator::WhileLabels::WhileLabels((WhileLabels *)&stack0xffffffffffffff98,beginLabel,endLabel)
  ;
  wl._endLabel = in_stack_fffffffffffffe54;
  wl._beginLabel = in_stack_fffffffffffffe50;
  dest = in_stack_ffffffffffffff98;
  irGenerator::irGenerator::pushWhile(in_stack_fffffffffffffe48,wl);
  irGenerator::irGenerator::ir_label(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  match_one_word(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  match_one_word(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  gm_cond((SyntaxAnalyze *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  std::shared_ptr<front::express::ExpressNode>::operator=
            ((shared_ptr<front::express::ExpressNode> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe48);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ae967);
  peVar1 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ae974);
  if (peVar1->_type == CNS) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x2ae9a9);
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ae9b6);
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (int *)in_stack_fffffffffffffe48);
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
              ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe48);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
              (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffe48);
    irGenerator::irGenerator::ir_assign
              ((irGenerator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (LeftVal *)dest,(RightVal *)in_stack_ffffffffffffff98);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2aea2e);
    std::
    variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2aea3b);
    std::optional<std::__cxx11::string>::operator=
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2aea5f);
    std::__cxx11::string::~string(local_a0);
  }
  else {
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2aeb29);
    std::optional<std::__cxx11::string>::operator=
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_stack_fffffffffffffe48);
  irGenerator::irGenerator::ir_jump
            ((irGenerator *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2aeba5);
  irGenerator::irGenerator::ir_label(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  match_one_word(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  gm_stmt(in_stack_ffffffffffffff10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  irGenerator::irGenerator::ir_jump
            ((irGenerator *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2aec2e);
  irGenerator::irGenerator::ir_label(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  irGenerator::irGenerator::popWhile((irGenerator *)0x2aec53);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2aec62);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2aec6f);
  return;
}

Assistant:

void SyntaxAnalyze::gm_while_stmt_normal() {
  SharedExNdPtr cond;
  LabelId whileTrue = irGenerator.getNewLabelId();
  LabelId whileEnd = irGenerator.getNewLabelId();
  LabelId whileBegin = irGenerator.getNewLabelId();
  std::optional<string> condStr;
  irGenerator::WhileLabels whileLabels =
      irGenerator::WhileLabels(whileBegin, whileEnd);

  irGenerator.pushWhile(whileLabels);
  irGenerator.ir_label(whileBegin);

  match_one_word(Token::WHILETK);
  match_one_word(Token::LPARENT);

  cond = gm_cond();

  if (cond->_type == NodeType::CNS) {
    string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
    RightVal right;
    right.emplace<0>(cond->_value);
    irGenerator.ir_assign(tmpName, right);
    condStr = tmpName;
  } else {
    condStr = cond->_name;
  }
  irGenerator.ir_jump(mir::inst::JumpInstructionKind::BrCond, whileTrue,
                      whileEnd, condStr, mir::inst::JumpKind::Loop);
  irGenerator.ir_label(whileTrue);

  match_one_word(Token::RPARENT);
  gm_stmt();

  irGenerator.ir_jump(mir::inst::JumpInstructionKind::Br, whileBegin, -1,
                      std::nullopt, mir::inst::JumpKind::Loop);
  irGenerator.ir_label(whileEnd);
  irGenerator.popWhile();
}